

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14InvalidonlySomeReasonsTest16<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
TestBody(Section14InvalidonlySomeReasonsTest16<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
         *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.14.16";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006bef70,(char *(*) [3])&PTR_anon_var_dwarf_3f4b94_006bef90,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14InvalidonlySomeReasonsTest16) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "onlySomeReasonsCA1Cert",
                               "InvalidonlySomeReasonsTest16EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "onlySomeReasonsCA1compromiseCRL",
                              "onlySomeReasonsCA1otherreasonsCRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.16";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}